

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

istream * Json::operator>>(istream *sin,Value *root)

{
  FILE *__stream;
  undefined8 uVar1;
  runtime_error *this;
  string local_160;
  undefined1 local_129;
  undefined1 local_128 [7];
  bool ok;
  Reader reader;
  Value *root_local;
  istream *sin_local;
  
  reader._264_8_ = root;
  Reader::Reader((Reader *)local_128);
  local_129 = Reader::parse((Reader *)local_128,sin,(Value *)reader._264_8_,true);
  __stream = _stderr;
  if (!(bool)local_129) {
    Reader::getFormattedErrorMessages_abi_cxx11_(&local_160,(Reader *)local_128);
    uVar1 = std::__cxx11::string::c_str();
    fprintf(__stream,"Error from reader: %s",uVar1);
    std::__cxx11::string::~string((string *)&local_160);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"reader error");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Reader::~Reader((Reader *)local_128);
  return sin;
}

Assistant:

std::istream& operator>>(std::istream& sin, Value& root) {
  Json::Reader reader;
  bool ok = reader.parse(sin, root, true);
  if (!ok) {
    fprintf(stderr,
            "Error from reader: %s",
            reader.getFormattedErrorMessages().c_str());

    JSON_FAIL_MESSAGE("reader error");
  }
  return sin;
}